

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::DvpVerifyDynamicAllocation
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffer)

{
  BufferDesc *Args;
  int iVar1;
  pointer pMVar2;
  Uint64 UVar3;
  Int32 IVar4;
  char (*in_RCX) [32];
  ulong uVar5;
  ulong uVar6;
  char (*in_R8) [94];
  string msg;
  Uint64 local_38;
  
  if (pBuffer == (BufferVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x8123a6,
               (char (*) [19])in_RCX);
    in_RCX = (char (*) [32])0x8f1;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x8f1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pBuffer->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    if ((pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc.Usage != USAGE_DYNAMIC) {
      FormatString<char[26],char[32]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BuffDesc.Usage == USAGE_DYNAMIC",in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8f7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    Args = &(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc;
    uVar6 = (ulong)(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
    if (uVar6 == 0xffffffff) {
      FormatString<char[17],char_const*,char[34]>
                (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                 (char **)"\' does not have dynamic buffer ID",(char (*) [34])in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8fa);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pMVar2 = (this->m_MappedBuffers).
             super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->m_MappedBuffers).
                   super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
            -0x3333333333333333;
    if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
      FormatString<char[17],char_const*,char[94]>
                (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                 (char **)
                 "\' has not been mapped. Note: memory for dynamic buffers is allocated when a buffer is mapped."
                 ,in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8fe);
    }
    else {
      if (pMVar2[uVar6].Allocation.pDynamicMemMgr == (VulkanDynamicMemoryManager *)0x0) {
        local_38 = CONCAT71(local_38._1_7_,
                            (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.ContextId);
        FormatString<char[17],char_const*,char[57],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[73]>
                  (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                   (char **)"\' has not been mapped before its first use. Context Id: ",
                   (char (*) [57])&local_38,
                   (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)0x82388b,
                   (char (*) [73])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x904);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      UVar3 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FrameNumber;
      if (pMVar2[uVar6].Allocation.dvpFrameNumber != UVar3) {
        local_38 = UVar3;
        FormatString<char[39],char_const*,char[12],unsigned_long,char[156]>
                  (&msg,(Diligent *)"Dynamic allocation of dynamic buffer \'",(char (*) [39])Args,
                   (char **)"\' in frame ",(char (*) [12])&local_38,
                   (unsigned_long *)
                   " is out-of-date. Note: contents of all dynamic resources is discarded at the end of every frame. A buffer must be mapped before its first use in any frame."
                   ,(char (*) [156])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x907);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      iVar1 = pMVar2[uVar6].DvpBufferUID;
      IVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)pBuffer);
      if (iVar1 == IVar4) {
        return;
      }
      IVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)pBuffer);
      local_38 = CONCAT44(local_38._4_4_,IVar4);
      FormatString<char[37],char_const*,char[10],int,char[37],int,char[106]>
                (&msg,(Diligent *)"Dynamic buffer ID mismatch. Buffer \'",(char (*) [37])Args,
                 (char **)"\' has ID ",(char (*) [10])&local_38,
                 (int *)" but the ID of the mapped buffer is ",
                 (char (*) [37])&pMVar2[uVar6].DvpBufferUID,
                 (int *)
                 ". This indicates that dynamic space has been reassigned to a different buffer, which has not been mapped."
                 ,(char (*) [106])msg._M_dataplus._M_p);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x90a);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DvpVerifyDynamicAllocation(const BufferVkImpl* pBuffer) const
{
    VERIFY_EXPR(pBuffer != nullptr);

    if (pBuffer->m_VulkanBuffer != VK_NULL_HANDLE)
        return;

    const BufferDesc& BuffDesc = pBuffer->GetDesc();
    VERIFY_EXPR(BuffDesc.Usage == USAGE_DYNAMIC);

    const Uint32 DynamicBufferId = pBuffer->GetDynamicBufferId();
    VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", pBuffer->GetDesc().Name, "' does not have dynamic buffer ID");

    if (DynamicBufferId >= m_MappedBuffers.size())
    {
        DEV_ERROR("Dynamic buffer '", BuffDesc.Name, "' has not been mapped. Note: memory for dynamic buffers is allocated when a buffer is mapped.");
        return;
    }

    const MappedBuffer& MappedBuff = m_MappedBuffers[DynamicBufferId];
    DEV_CHECK_ERR(MappedBuff.Allocation.pDynamicMemMgr != nullptr, "Dynamic buffer '", BuffDesc.Name, "' has not been mapped before its first use. Context Id: ", GetContextId(),
                  ". Note: memory for dynamic buffers is allocated when a buffer is mapped.");

    DEV_CHECK_ERR(MappedBuff.Allocation.dvpFrameNumber == GetFrameNumber(), "Dynamic allocation of dynamic buffer '", BuffDesc.Name, "' in frame ", GetFrameNumber(),
                  " is out-of-date. Note: contents of all dynamic resources is discarded at the end of every frame. A buffer must be mapped before its first use in any frame.");

    DEV_CHECK_ERR(MappedBuff.DvpBufferUID == pBuffer->GetUniqueID(), "Dynamic buffer ID mismatch. Buffer '", BuffDesc.Name, "' has ID ", pBuffer->GetUniqueID(), " but the ID of the mapped buffer is ",
                  MappedBuff.DvpBufferUID, ". This indicates that dynamic space has been reassigned to a different buffer, which has not been mapped.");
}